

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

XmlWriter * __thiscall
Catch::XmlWriter::writeAttribute<char[8]>(XmlWriter *this,string *name,char (*attribute) [8])

{
  size_t sVar1;
  ReusableStringStream rss;
  string local_58;
  ReusableStringStream local_38;
  
  ReusableStringStream::ReusableStringStream(&local_38);
  sVar1 = strlen(*attribute);
  std::__ostream_insert<char,std::char_traits<char>>(local_38.m_oss,*attribute,sVar1);
  std::__cxx11::stringbuf::str();
  writeAttribute(this,name,&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  ReusableStringStream::~ReusableStringStream(&local_38);
  return this;
}

Assistant:

XmlWriter& writeAttribute( std::string const& name, T const& attribute ) {
            ReusableStringStream rss;
            rss << attribute;
            return writeAttribute( name, rss.str() );
        }